

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPL3.cpp
# Opt level: O0

void __thiscall Channel::update_2_KON1_BLOCK3_FNUMH2(Channel *this,OPL3 *OPL3)

{
  uint uVar1;
  int iVar2;
  int newKon;
  int _2_kon1_block3_fnumh2;
  OPL3 *OPL3_local;
  Channel *this_local;
  
  uVar1 = (uint)OPL3->registers[this->channelBaseAddress + 0xb0];
  this->block = (int)(uVar1 & 0x1c) >> 2;
  this->fnumh = uVar1 & 3;
  (*this->_vptr_Channel[5])(this,OPL3);
  iVar2 = (int)(uVar1 & 0x20) >> 5;
  if (iVar2 != this->kon) {
    if (iVar2 == 1) {
      (*this->_vptr_Channel[3])();
    }
    else {
      (*this->_vptr_Channel[4])();
    }
    this->kon = iVar2;
  }
  return;
}

Assistant:

void Channel::update_2_KON1_BLOCK3_FNUMH2(OPL3 *OPL3) {
	
	int _2_kon1_block3_fnumh2 = OPL3->registers[channelBaseAddress+ChannelData::_2_KON1_BLOCK3_FNUMH2_Offset];
	
	// Frequency Number (hi-register) and Block. These two registers, together with fnuml, 
	// sets the Channel´s base frequency;
	block = (_2_kon1_block3_fnumh2 & 0x1C) >> 2;
	fnumh = _2_kon1_block3_fnumh2 & 0x03;        
	updateOperators(OPL3);
	
	// Key On. If changed, calls Channel.keyOn() / keyOff().
	int newKon   = (_2_kon1_block3_fnumh2 & 0x20) >> 5;
	if(newKon != kon) {
		if(newKon == 1) keyOn();
		else keyOff();
		kon = newKon;
	}
}